

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::toString_abi_cxx11_(string *__return_storage_ptr__,Catch *this,wchar_t *value)

{
  allocator<char> local_4e;
  byte local_4d;
  byte local_3a;
  allocator<wchar_t> local_39;
  wstring local_38;
  Catch *local_18;
  wchar_t *value_local;
  
  local_3a = 0;
  local_4d = 0;
  local_18 = this;
  value_local = (wchar_t *)__return_storage_ptr__;
  if (this == (Catch *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"{null string}",&local_4e);
    std::allocator<char>::~allocator(&local_4e);
  }
  else {
    std::allocator<wchar_t>::allocator();
    local_3a = 1;
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&local_38,(wchar_t *)this,&local_39);
    local_4d = 1;
    toString(__return_storage_ptr__,&local_38);
  }
  if ((local_4d & 1) != 0) {
    std::__cxx11::wstring::~wstring((wstring *)&local_38);
  }
  if ((local_3a & 1) != 0) {
    std::allocator<wchar_t>::~allocator(&local_39);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString( const wchar_t* const value )
{
	return value ? Catch::toString( std::wstring(value) ) : std::string( "{null string}" );
}